

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool anon_unknown.dwarf_1617b::VersionCompare(CompareOp op,char *lhss,char *rhss)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  uint unaff_EBP;
  char *pcVar9;
  char *__s1;
  char *pcVar10;
  
  do {
    if ((9 < (byte)(*lhss - 0x30U)) && (9 < (byte)(*rhss - 0x30U))) {
      bVar6 = (byte)op & 1;
      break;
    }
    pcVar10 = lhss + -1;
    __s1 = pcVar10;
    do {
      pcVar10 = pcVar10 + 1;
      pcVar9 = __s1 + 1;
      __s1 = __s1 + 1;
    } while (*pcVar9 == '0');
    pcVar9 = rhss + -1;
    do {
      rhss = pcVar9;
      pcVar9 = rhss + 1;
    } while (rhss[1] == '0');
    lVar4 = -1;
    pcVar5 = __s1;
    do {
      lhss = pcVar5;
      lVar8 = lVar4;
      cVar1 = *lhss;
      lVar4 = lVar8 + -1;
      pcVar5 = lhss + 1;
    } while ((byte)(cVar1 - 0x30U) < 10);
    do {
      cVar2 = rhss[1];
      rhss = rhss + 1;
      lVar8 = lVar8 + 1;
    } while ((byte)(cVar2 - 0x30U) < 10);
    if (lVar8 == 0) {
      iVar7 = strncmp(__s1,pcVar9,(long)lhss - (long)pcVar10);
      lVar8 = (long)iVar7;
    }
    else {
      lVar8 = -lVar8;
    }
    if (lVar8 < 0) {
      bVar3 = false;
      unaff_EBP = (op & OP_LESS) >> 1;
    }
    else if (lVar8 == 0) {
      rhss = rhss + (cVar2 == '.');
      lhss = lhss + (cVar1 == '.');
      bVar3 = true;
    }
    else {
      bVar3 = false;
      unaff_EBP = (op & OP_GREATER) >> 2;
    }
    bVar6 = (byte)unaff_EBP;
  } while (bVar3);
  return (bool)(bVar6 & 1);
}

Assistant:

bool VersionCompare(cmSystemTools::CompareOp op, const char* lhss,
                    const char* rhss)
{
  const char* endl = lhss;
  const char* endr = rhss;

  while (((*endl >= '0') && (*endl <= '9')) ||
         ((*endr >= '0') && (*endr <= '9'))) {
    // Do component-wise comparison, ignoring leading zeros
    // (components are treated as integers, not as mantissas)
    while (*endl == '0') {
      endl++;
    }
    while (*endr == '0') {
      endr++;
    }

    const char* beginl = endl;
    const char* beginr = endr;

    // count significant digits
    while ((*endl >= '0') && (*endl <= '9')) {
      endl++;
    }
    while ((*endr >= '0') && (*endr <= '9')) {
      endr++;
    }

    // compare number of digits first
    ptrdiff_t r = ((endl - beginl) - (endr - beginr));
    if (r == 0) {
      // compare the digits if number of digits is equal
      r = strncmp(beginl, beginr, endl - beginl);
    }

    if (r < 0) {
      // lhs < rhs, so true if operation is LESS
      return (op & cmSystemTools::OP_LESS) != 0;
    }
    if (r > 0) {
      // lhs > rhs, so true if operation is GREATER
      return (op & cmSystemTools::OP_GREATER) != 0;
    }

    if (*endr == '.') {
      endr++;
    }

    if (*endl == '.') {
      endl++;
    }
  }
  // lhs == rhs, so true if operation is EQUAL
  return (op & cmSystemTools::OP_EQUAL) != 0;
}